

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdjpeg.c
# Opt level: O1

void progress_monitor(j_common_ptr cinfo)

{
  int iVar1;
  jpeg_progress_mgr *pjVar2;
  ulong uVar3;
  uint uVar4;
  long *plVar5;
  
  pjVar2 = cinfo->progress;
  iVar1 = (int)pjVar2[1].pass_counter;
  if (((iVar1 != 0) && (cinfo->is_decompressor != 0)) &&
     (uVar4 = *(uint *)((long)&cinfo[4].mem + 4), plVar5 = (long *)(ulong)uVar4, iVar1 < (int)uVar4)
     ) {
    progress_monitor_cold_1();
    if (*(int *)(*plVar5 + 0x7c) != 0) {
      return;
    }
    end_progress_monitor_cold_1();
    return;
  }
  if (*(int *)((long)&pjVar2[1].pass_counter + 4) != 0) {
    uVar3 = (pjVar2->pass_counter * 100) / pjVar2->pass_limit;
    if ((int)pjVar2[1].pass_limit != (int)uVar3) {
      uVar4 = *(int *)((long)&pjVar2[1].progress_monitor + 4) + pjVar2->total_passes;
      *(int *)&pjVar2[1].pass_limit = (int)uVar3;
      if ((int)uVar4 < 2) {
        fprintf(_stderr,"\r %3d%% ",uVar3 & 0xffffffff);
      }
      else {
        fprintf(_stderr,"\rPass %d/%d: %3d%% ",
                (ulong)(pjVar2->completed_passes + *(int *)&pjVar2[1].progress_monitor + 1),
                (ulong)uVar4,uVar3 & 0xffffffff);
      }
      fflush(_stderr);
      return;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
progress_monitor(j_common_ptr cinfo)
{
  cd_progress_ptr prog = (cd_progress_ptr)cinfo->progress;

  if (prog->max_scans != 0 && cinfo->is_decompressor) {
    int scan_no = ((j_decompress_ptr)cinfo)->input_scan_number;

    if (scan_no > (int)prog->max_scans) {
      fprintf(stderr, "Scan number %d exceeds maximum scans (%d)\n", scan_no,
              prog->max_scans);
      exit(EXIT_FAILURE);
    }
  }

  if (prog->report) {
    int total_passes = prog->pub.total_passes + prog->total_extra_passes;
    int percent_done =
      (int)(prog->pub.pass_counter * 100L / prog->pub.pass_limit);

    if (percent_done != prog->percent_done) {
      prog->percent_done = percent_done;
      if (total_passes > 1) {
        fprintf(stderr, "\rPass %d/%d: %3d%% ",
                prog->pub.completed_passes + prog->completed_extra_passes + 1,
                total_passes, percent_done);
      } else {
        fprintf(stderr, "\r %3d%% ", percent_done);
      }
      fflush(stderr);
    }
  }
}